

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SField.cpp
# Opt level: O0

void __thiscall jbcoin::SField::SField(SField *this,int fc)

{
  int fc_local;
  SField *this_local;
  
  this->fieldCode = fc;
  this->fieldType = STI_UNKNOWN;
  this->fieldValue = 0;
  std::__cxx11::string::string((string *)&this->fieldName);
  this->fieldMeta = 0;
  num = num + 1;
  this->fieldNum = num;
  this->signingField = yes;
  getName_abi_cxx11_(&this->jsonName,this);
  return;
}

Assistant:

SField::SField (int fc)
    : fieldCode (fc)
    , fieldType (STI_UNKNOWN)
    , fieldValue (0)
    , fieldMeta (sMD_Never)
    , fieldNum (++num)
    , signingField (IsSigning::yes)
    , jsonName (getName ())
{
}